

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseTopLevelStatement
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location)

{
  ErrorCollector *pEVar1;
  void **ppvVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  DescriptorProto *message;
  EnumDescriptorProto *enum_type;
  ServiceDescriptorProto *service;
  FileOptions *options;
  int iVar6;
  LocationRecorder location;
  LocationRecorder local_48;
  Tokenizer *local_38;
  
  bVar3 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  bVar4 = true;
  if (!bVar3) {
    iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar5 == 0) {
      LocationRecorder::LocationRecorder
                (&local_48,root_location,4,
                 (file->message_type_).super_RepeatedPtrFieldBase.current_size_);
      iVar5 = (file->message_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar6 = (file->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar5 < iVar6) {
        ppvVar2 = (file->message_type_).super_RepeatedPtrFieldBase.elements_;
        (file->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
        message = (DescriptorProto *)ppvVar2[iVar5];
      }
      else {
        if (iVar6 == (file->message_type_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(file->message_type_).super_RepeatedPtrFieldBase,iVar6 + 1);
          iVar6 = (file->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (file->message_type_).super_RepeatedPtrFieldBase.allocated_size_ = iVar6 + 1;
        message = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
        ppvVar2 = (file->message_type_).super_RepeatedPtrFieldBase.elements_;
        iVar5 = (file->message_type_).super_RepeatedPtrFieldBase.current_size_;
        (file->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
        ppvVar2[iVar5] = message;
      }
      bVar4 = ParseMessageDefinition(this,message,&local_48);
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
      if (iVar5 == 0) {
        LocationRecorder::LocationRecorder
                  (&local_48,root_location,5,
                   (file->enum_type_).super_RepeatedPtrFieldBase.current_size_);
        iVar5 = (file->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        iVar6 = (file->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
        if (iVar5 < iVar6) {
          ppvVar2 = (file->enum_type_).super_RepeatedPtrFieldBase.elements_;
          (file->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
          enum_type = (EnumDescriptorProto *)ppvVar2[iVar5];
        }
        else {
          if (iVar6 == (file->enum_type_).super_RepeatedPtrFieldBase.total_size_) {
            internal::RepeatedPtrFieldBase::Reserve
                      (&(file->enum_type_).super_RepeatedPtrFieldBase,iVar6 + 1);
            iVar6 = (file->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
          }
          (file->enum_type_).super_RepeatedPtrFieldBase.allocated_size_ = iVar6 + 1;
          enum_type = internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>::New();
          ppvVar2 = (file->enum_type_).super_RepeatedPtrFieldBase.elements_;
          iVar5 = (file->enum_type_).super_RepeatedPtrFieldBase.current_size_;
          (file->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
          ppvVar2[iVar5] = enum_type;
        }
        bVar4 = ParseEnumDefinition(this,enum_type,&local_48);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar5 == 0) {
          LocationRecorder::LocationRecorder
                    (&local_48,root_location,6,
                     (file->service_).super_RepeatedPtrFieldBase.current_size_);
          iVar5 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
          iVar6 = (file->service_).super_RepeatedPtrFieldBase.allocated_size_;
          if (iVar5 < iVar6) {
            ppvVar2 = (file->service_).super_RepeatedPtrFieldBase.elements_;
            (file->service_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
            service = (ServiceDescriptorProto *)ppvVar2[iVar5];
          }
          else {
            if (iVar6 == (file->service_).super_RepeatedPtrFieldBase.total_size_) {
              internal::RepeatedPtrFieldBase::Reserve
                        (&(file->service_).super_RepeatedPtrFieldBase,iVar6 + 1);
              iVar6 = (file->service_).super_RepeatedPtrFieldBase.allocated_size_;
            }
            (file->service_).super_RepeatedPtrFieldBase.allocated_size_ = iVar6 + 1;
            service = internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>::New();
            ppvVar2 = (file->service_).super_RepeatedPtrFieldBase.elements_;
            iVar5 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
            (file->service_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
            ppvVar2[iVar5] = service;
          }
          bVar4 = ParseServiceDefinition(this,service,&local_48);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if (iVar5 == 0) {
            LocationRecorder::LocationRecorder(&local_48,root_location,7);
            bVar4 = ParseExtend(this,&file->extension_,&file->message_type_,root_location,4,
                                &local_48);
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar5 == 0) {
              bVar3 = ParseImport(this,&file->dependency_,&file->public_dependency_,
                                  &file->weak_dependency_,root_location);
              return bVar3;
            }
            iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar5 == 0) {
              bVar3 = ParsePackage(this,file,root_location);
              return bVar3;
            }
            iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar5 != 0) {
              local_48.parser_ = (Parser *)&stack0xffffffffffffffc8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_48,"Expected top-level statement (e.g. \"message\").","");
              pEVar1 = this->error_collector_;
              if (pEVar1 != (ErrorCollector *)0x0) {
                (*pEVar1->_vptr_ErrorCollector[2])
                          (pEVar1,(ulong)(uint)(this->input_->current_).line,
                           (ulong)(uint)(this->input_->current_).column,&local_48);
              }
              this->had_errors_ = true;
              if (local_48.parser_ != (Parser *)&stack0xffffffffffffffc8) {
                operator_delete(local_48.parser_,(ulong)((long)&(local_38->current_).type + 1));
              }
              return false;
            }
            LocationRecorder::LocationRecorder(&local_48,root_location,8);
            options = FileDescriptorProto::mutable_options(file);
            bVar4 = ParseOption(this,&options->super_Message,&local_48,OPTION_STATEMENT);
          }
        }
      }
    }
    LocationRecorder::~LocationRecorder(&local_48);
  }
  return bVar4;
}

Assistant:

bool Parser::ParseTopLevelStatement(FileDescriptorProto* file,
                                    const LocationRecorder& root_location) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(root_location,
      FileDescriptorProto::kMessageTypeFieldNumber, file->message_type_size());
    return ParseMessageDefinition(file->add_message_type(), location);
  } else if (LookingAt("enum")) {
    LocationRecorder location(root_location,
      FileDescriptorProto::kEnumTypeFieldNumber, file->enum_type_size());
    return ParseEnumDefinition(file->add_enum_type(), location);
  } else if (LookingAt("service")) {
    LocationRecorder location(root_location,
      FileDescriptorProto::kServiceFieldNumber, file->service_size());
    return ParseServiceDefinition(file->add_service(), location);
  } else if (LookingAt("extend")) {
    LocationRecorder location(root_location,
        FileDescriptorProto::kExtensionFieldNumber);
    return ParseExtend(file->mutable_extension(),
                       file->mutable_message_type(),
                       root_location,
                       FileDescriptorProto::kMessageTypeFieldNumber,
                       location);
  } else if (LookingAt("import")) {
    return ParseImport(file->mutable_dependency(),
                       file->mutable_public_dependency(),
                       file->mutable_weak_dependency(),
                       root_location);
  } else if (LookingAt("package")) {
    return ParsePackage(file, root_location);
  } else if (LookingAt("option")) {
    LocationRecorder location(root_location,
        FileDescriptorProto::kOptionsFieldNumber);
    return ParseOption(file->mutable_options(), location, OPTION_STATEMENT);
  } else {
    AddError("Expected top-level statement (e.g. \"message\").");
    return false;
  }
}